

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

pboolean p_socket_listen(PSocket *socket,PError **error)

{
  pboolean pVar1;
  int iVar2;
  pint pVar3;
  PErrorIO code;
  PError **error_local;
  PSocket *socket_local;
  
  if (socket == (PSocket *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    socket_local._4_4_ = 0;
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 == 0) {
      socket_local._4_4_ = 0;
    }
    else {
      iVar2 = listen(socket->fd,socket->listen_backlog);
      if (iVar2 < 0) {
        pVar3 = p_error_get_last_net();
        code = p_error_get_io_from_system(pVar3);
        pVar3 = p_error_get_last_net();
        p_error_set_error_p(error,code,pVar3,"Failed to call listen() on socket");
        socket_local._4_4_ = 0;
      }
      else {
        socket->field_0x18 = socket->field_0x18 & 0xef | 0x10;
        socket_local._4_4_ = 1;
      }
    }
  }
  return socket_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_socket_listen (PSocket	*socket,
		 PError		**error)
{
	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	if (P_UNLIKELY (listen (socket->fd, socket->listen_backlog) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call listen() on socket");
		return FALSE;
	}

	socket->listening = TRUE;
	return TRUE;
}